

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

int __thiscall chrono::ChArchiveIn::VersionRead<chrono::ChVariablesBodyOwnMass>(ChArchiveIn *this)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  key_type local_28;
  
  iVar1 = 99999;
  if (this[0x48] == (ChArchiveIn)0x1) {
    if (this[8] != (ChArchiveIn)0x1) {
      iVar1 = (**(code **)(*(long *)this + 0x88))(this,&ChVariablesBodyOwnMass::typeinfo);
      return iVar1;
    }
    local_28._M_target = (type_info *)&ChVariablesBodyOwnMass::typeinfo;
    iVar2 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x10),&local_28);
    if (iVar2.super__Node_iterator_base<std::pair<const_std::type_index,_int>,_false>._M_cur ==
        (__node_type *)0x0) {
      iVar1 = (**(code **)(*(long *)this + 0x88))(this,&ChVariablesBodyOwnMass::typeinfo);
      local_28._M_target = (type_info *)&ChVariablesBodyOwnMass::typeinfo;
      pmVar3 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(this + 0x10),&local_28);
      *pmVar3 = iVar1;
    }
  }
  return iVar1;
}

Assistant:

int VersionRead() {
          int iv = 99999;
          if (!use_versions)
              return iv;
          if (this->cluster_class_versions) {
              if (this->class_versions.find(std::type_index(typeid(T))) == this->class_versions.end()) {
                int jv = this->in_version(typeid(T));
                this->class_versions[std::type_index(typeid(T))] = jv;
                return jv;
              } 
          } 
          else {
              return this->in_version(typeid(T));
          }
          return iv;
      }